

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Address.cpp
# Opt level: O0

String __thiscall Network::Address::Ethernet::getAdapterName(Ethernet *this)

{
  undefined1 auVar1 [16];
  undefined8 uVar2;
  int iVar3;
  uchar *extraout_RDX;
  uchar *extraout_RDX_00;
  uchar *extraout_RDX_01;
  uchar *extraout_RDX_02;
  uchar *puVar4;
  long in_RSI;
  String SVar5;
  int local_448;
  int i;
  int nInterfaces;
  ifreq *ifr;
  char buf [1024];
  int local_30 [2];
  ifconf ifc;
  int descriptor;
  Ethernet *this_local;
  
  ifc.ifc_ifcu._4_4_ = socket(2,2,0);
  if (ifc.ifc_ifcu._4_4_ == -1) {
    Bstrlib::String::String((String *)this,"");
    puVar4 = extraout_RDX;
  }
  else {
    memset(local_30,0,0x10);
    local_30[0] = 0x400;
    ifc._0_8_ = &ifr;
    iVar3 = ioctl(ifc.ifc_ifcu._4_4_,0x8912,local_30);
    uVar2 = ifc._0_8_;
    if (iVar3 < 0) {
      close(ifc.ifc_ifcu._4_4_);
      Bstrlib::String::String((String *)this,"");
      puVar4 = extraout_RDX_00;
    }
    else {
      auVar1._8_8_ = 0;
      auVar1._0_8_ = (long)local_30[0];
      for (local_448 = 0; local_448 < SUB164(auVar1 / ZEXT816(0x28),0); local_448 = local_448 + 1) {
        iVar3 = ioctl(ifc.ifc_ifcu._4_4_,0x8927,uVar2 + (long)local_448 * 0x28);
        if ((-1 < iVar3) &&
           (iVar3 = memcmp((void *)(uVar2 + (long)local_448 * 0x28 + 0x12),(void *)(in_RSI + 8),6),
           iVar3 == 0)) {
          close(ifc.ifc_ifcu._4_4_);
          Bstrlib::String::String((String *)this,(char *)(uVar2 + (long)local_448 * 0x28));
          puVar4 = extraout_RDX_01;
          goto LAB_00118271;
        }
      }
      close(ifc.ifc_ifcu._4_4_);
      Bstrlib::String::String((String *)this,"");
      puVar4 = extraout_RDX_02;
    }
  }
LAB_00118271:
  SVar5.super_tagbstring.data = puVar4;
  SVar5.super_tagbstring._0_8_ = this;
  return (String)SVar5.super_tagbstring;
}

Assistant:

String Ethernet::getAdapterName() const
        {
            int descriptor = socket(AF_INET, SOCK_DGRAM, 0);
            if (descriptor == -1) return "";
            // Then set the available options
            struct ifconf ifc = {}; // To enumerate all interfaces
            // Need to get the interface name based on its mac address
            // Get all interfaces
            char buf[1024];
            ifc.ifc_len = sizeof(buf);
            ifc.ifc_buf = buf;
            if (ioctl(descriptor, SIOCGIFCONF, &ifc) < 0) { close(descriptor); return ""; }

            // Find the given local interface
            struct ifreq * ifr = ifc.ifc_req;
    	    int nInterfaces = ifc.ifc_len / sizeof(struct ifreq);
    	    for(int i = 0; i < nInterfaces; i++)
    	    {
                // Get HW address for this interface
                if (ioctl(descriptor, SIOCGIFHWADDR, &ifr[i]) < 0) continue;
    		    if (memcmp(ifr[i].ifr_hwaddr.sa_data, address, ArrSz(address)) == 0)
                {
                    close(descriptor);
                    return ifr[i].ifr_name;
                }
            }
            close(descriptor);
            return "";
        }